

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSiteNameCommand.cxx
# Opt level: O2

bool __thiscall
cmSiteNameCommand::InitialPass
          (cmSiteNameCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  long lVar3;
  string hostname_cmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string host;
  RegularExpression hostReg;
  string siteName;
  string hostRegExp;
  string local_40;
  
  lVar3 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (lVar3 == 0x20) {
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&hostReg,"/usr/bsd",(allocator *)&hostname_cmd);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&paths,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hostReg);
    std::__cxx11::string::~string((string *)&hostReg);
    std::__cxx11::string::string((string *)&hostReg,"/usr/sbin",(allocator *)&hostname_cmd);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&paths,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hostReg);
    std::__cxx11::string::~string((string *)&hostReg);
    std::__cxx11::string::string((string *)&hostReg,"/usr/bin",(allocator *)&hostname_cmd);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&paths,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hostReg);
    std::__cxx11::string::~string((string *)&hostReg);
    std::__cxx11::string::string((string *)&hostReg,"/bin",(allocator *)&hostname_cmd);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&paths,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hostReg);
    std::__cxx11::string::~string((string *)&hostReg);
    std::__cxx11::string::string((string *)&hostReg,"/sbin",(allocator *)&hostname_cmd);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&paths,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hostReg);
    std::__cxx11::string::~string((string *)&hostReg);
    std::__cxx11::string::string((string *)&hostReg,"/usr/local/bin",(allocator *)&hostname_cmd);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&paths,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hostReg);
    std::__cxx11::string::~string((string *)&hostReg);
    pcVar2 = cmMakefile::GetDefinition
                       ((this->super_cmCommand).Makefile,
                        (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
    if (pcVar2 == (char *)0x0) {
      this_00 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string((string *)&hostReg,"HOSTNAME",(allocator *)&hostname_cmd);
      pcVar2 = cmMakefile::GetDefinition(this_00,(string *)&hostReg);
      std::__cxx11::string::~string((string *)&hostReg);
      hostname_cmd._M_dataplus._M_p = (pointer)&hostname_cmd.field_2;
      hostname_cmd._M_string_length = 0;
      hostname_cmd.field_2._M_local_buf[0] = '\0';
      if (pcVar2 == (char *)0x0) {
        cmsys::SystemTools::FindProgram((string *)&hostReg,"hostname",&paths,false);
        std::__cxx11::string::operator=((string *)&hostname_cmd,(string *)&hostReg);
        std::__cxx11::string::~string((string *)&hostReg);
      }
      else {
        std::__cxx11::string::assign((char *)&hostname_cmd);
      }
      std::__cxx11::string::string((string *)&siteName,"unknown",(allocator *)&hostReg);
      bVar1 = cmSystemTools::IsOff(hostname_cmd._M_dataplus._M_p);
      if (!bVar1) {
        host._M_dataplus._M_p = (pointer)&host.field_2;
        host._M_string_length = 0;
        host.field_2._M_local_buf[0] = '\0';
        cmSystemTools::RunSingleCommand
                  (hostname_cmd._M_dataplus._M_p,&host,(string *)0x0,(int *)0x0,(char *)0x0,
                   OUTPUT_NONE,0.0);
        if (host._M_string_length != 0) {
          std::__cxx11::string::string
                    ((string *)&hostRegExp,"[ \t\n\r]*([^\t\n\r ]*)[ \t\n\r]*",(allocator *)&hostReg
                    );
          cmsys::RegularExpression::RegularExpression(&hostReg,hostRegExp._M_dataplus._M_p);
          bVar1 = cmsys::RegularExpression::find(&hostReg,host._M_dataplus._M_p);
          if (bVar1) {
            cmsys::RegularExpression::match_abi_cxx11_(&local_40,&hostReg,1);
            std::__cxx11::string::operator=((string *)&host,(string *)&local_40);
            std::__cxx11::string::~string((string *)&local_40);
          }
          if (host._M_string_length != 0) {
            std::__cxx11::string::_M_assign((string *)&siteName);
          }
          cmsys::RegularExpression::~RegularExpression(&hostReg);
          std::__cxx11::string::~string((string *)&hostRegExp);
        }
        std::__cxx11::string::~string((string *)&host);
      }
      cmMakefile::AddCacheDefinition
                ((this->super_cmCommand).Makefile,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,siteName._M_dataplus._M_p,
                 "Name of the computer/site where compile is being run",STRING,false);
      std::__cxx11::string::~string((string *)&siteName);
      std::__cxx11::string::~string((string *)&hostname_cmd);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&paths);
  }
  else {
    std::__cxx11::string::string
              ((string *)&hostReg,"called with incorrect number of arguments",
               (allocator *)&hostname_cmd);
    cmCommand::SetError(&this->super_cmCommand,(string *)&hostReg);
    std::__cxx11::string::~string((string *)&hostReg);
  }
  return lVar3 == 0x20;
}

Assistant:

bool cmSiteNameCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() != 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::vector<std::string> paths;
  paths.push_back("/usr/bsd");
  paths.push_back("/usr/sbin");
  paths.push_back("/usr/bin");
  paths.push_back("/bin");
  paths.push_back("/sbin");
  paths.push_back("/usr/local/bin");

  const char* cacheValue
    = this->Makefile->GetDefinition(args[0]);
  if(cacheValue)
    {
    return true;
    }

  const char *temp = this->Makefile->GetDefinition("HOSTNAME");
  std::string hostname_cmd;
  if(temp)
    {
    hostname_cmd = temp;
    }
  else
    {
    hostname_cmd = cmSystemTools::FindProgram("hostname", paths);
    }

  std::string siteName = "unknown";
#if defined(_WIN32) && !defined(__CYGWIN__)
  std::string host;
  if(cmSystemTools::ReadRegistryValue
     ("HKEY_LOCAL_MACHINE\\System\\CurrentControlSet\\"
      "Control\\ComputerName\\ComputerName;ComputerName", host))
    {
    siteName = host;
    }
#else
  // try to find the hostname for this computer
  if (!cmSystemTools::IsOff(hostname_cmd.c_str()))
    {
    std::string host;
    cmSystemTools::RunSingleCommand(hostname_cmd.c_str(),
      &host, 0, 0, 0, cmSystemTools::OUTPUT_NONE);

    // got the hostname
    if (!host.empty())
      {
      // remove any white space from the host name
      std::string hostRegExp = "[ \t\n\r]*([^\t\n\r ]*)[ \t\n\r]*";
      cmsys::RegularExpression hostReg (hostRegExp.c_str());
      if (hostReg.find(host.c_str()))
        {
        // strip whitespace
        host = hostReg.match(1);
        }

      if(!host.empty())
        {
        siteName = host;
        }
      }
    }
#endif
  this->Makefile->
    AddCacheDefinition(args[0],
                       siteName.c_str(),
                       "Name of the computer/site where compile is being run",
                       cmState::STRING);

  return true;
}